

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O3

void __thiscall efsw::DirWatcherGeneric::watchDir(DirWatcherGeneric *this,string *dir)

{
  pointer pcVar1;
  bool *pbVar2;
  DirWatcherGeneric *this_00;
  _Alloc_hider _Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  string local_58;
  string local_38;
  
  pbVar2 = FileWatcher::allowOutOfScopeLinks(this->Watch->WatcherImpl->mFileWatcher);
  if (*pbVar2 == true) {
    paVar4 = &local_38.field_2;
    pcVar1 = (dir->_M_dataplus)._M_p;
    local_38._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar1,pcVar1 + dir->_M_string_length);
    this_00 = findDirWatcher(this,&local_38);
    _Var3._M_p = local_38._M_dataplus._M_p;
  }
  else {
    paVar4 = &local_58.field_2;
    pcVar1 = (dir->_M_dataplus)._M_p;
    local_58._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar1,pcVar1 + dir->_M_string_length);
    this_00 = findDirWatcherFast(this,&local_58);
    _Var3._M_p = local_58._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != paVar4) {
    operator_delete(_Var3._M_p,paVar4->_M_allocated_capacity + 1);
  }
  if (this_00 != (DirWatcherGeneric *)0x0) {
    watch(this_00,true);
  }
  return;
}

Assistant:

void DirWatcherGeneric::watchDir( std::string &dir )
{
	DirWatcherGeneric * watcher = Watch->WatcherImpl->mFileWatcher->allowOutOfScopeLinks() ?
									findDirWatcher( dir ) :
									findDirWatcherFast( dir );

	if ( NULL != watcher )
	{
		watcher->watch( true );
	}
}